

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::countElementUnits
          (UCharsTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  long lVar1;
  UChar UVar2;
  UChar UVar3;
  ulong uVar4;
  int local_3c;
  
  uVar4 = (ulong)(uint)start;
  local_3c = 0;
  do {
    uVar4 = (ulong)(int)uVar4;
    UVar2 = UCharsTrieElement::charAt(this->elements + uVar4,unitIndex,&this->strings);
    lVar1 = uVar4 * 8;
    do {
      uVar4 = uVar4 + 1;
      if ((long)limit <= (long)uVar4) {
        return local_3c + 1;
      }
      UVar3 = UCharsTrieElement::charAt
                        ((UCharsTrieElement *)((long)&this->elements[1].stringOffset + lVar1),
                         unitIndex,&this->strings);
      lVar1 = lVar1 + 8;
    } while (UVar2 == UVar3);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int32_t
UCharsTrieBuilder::countElementUnits(int32_t start, int32_t limit, int32_t unitIndex) const {
    int32_t length=0;  // Number of different units at unitIndex.
    int32_t i=start;
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(i<limit && unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
        ++length;
    } while(i<limit);
    return length;
}